

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O3

int cgltf_parse_json_vec3
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,float **out_array,
              cgltf_size *out_size)

{
  jsmntok_t *tok;
  int iVar1;
  float *pfVar2;
  int iVar3;
  int iVar4;
  cgltf_float cVar5;
  ulong local_50;
  
  iVar1 = -1;
  if (((tokens[i].type == JSMN_OBJECT) && (iVar4 = tokens[i].size, 2 < iVar4)) &&
     (*out_array == (float *)0x0)) {
    pfVar2 = (float *)(*(options->memory).alloc)((options->memory).user_data,0xc);
    if (pfVar2 == (float *)0x0) {
      *out_array = (float *)0x0;
      iVar1 = -2;
    }
    else {
      iVar3 = i + 1;
      pfVar2[2] = 0.0;
      pfVar2[0] = 0.0;
      pfVar2[1] = 0.0;
      *out_array = pfVar2;
      local_50 = 0;
      do {
        if ((tokens[iVar3].type == JSMN_STRING) && (tok = tokens + iVar3, tok->size != 0)) {
          iVar1 = cgltf_json_strcmp(tok,json_chunk,"x");
          if (iVar1 == 0) {
            cVar5 = cgltf_json_to_float(tokens + (long)iVar3 + 1,json_chunk);
            *pfVar2 = cVar5;
LAB_00117dd8:
            iVar3 = iVar3 + 2;
            local_50 = local_50 + 1;
          }
          else {
            iVar1 = cgltf_json_strcmp(tok,json_chunk,"y");
            if (iVar1 == 0) {
              cVar5 = cgltf_json_to_float(tokens + (long)iVar3 + 1,json_chunk);
              pfVar2[1] = cVar5;
              goto LAB_00117dd8;
            }
            iVar1 = cgltf_json_strcmp(tok,json_chunk,"z");
            if (iVar1 == 0) {
              cVar5 = cgltf_json_to_float(tokens + (long)iVar3 + 1,json_chunk);
              pfVar2[2] = cVar5;
              goto LAB_00117dd8;
            }
            iVar3 = cgltf_skip_json(tokens,iVar3 + 1);
          }
          if (iVar3 < 0) {
            return iVar3;
          }
        }
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      iVar1 = -1;
      if (2 < local_50) {
        *out_size = local_50;
        iVar1 = iVar3;
      }
    }
  }
  return iVar1;
}

Assistant:

static int cgltf_parse_json_vec3(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, float** out_array, cgltf_size* out_size)
{
	if (tokens[i].type == JSMN_OBJECT) {
		int size = tokens[i].size; ++i;
		if (size < 3) {
			return CGLTF_ERROR_JSON;
		}
		else {
			if (*out_array) {
				return CGLTF_ERROR_JSON;
			}
			*out_array = (float*)cgltf_calloc(options, sizeof(cgltf_float), 3);
			if (!*out_array)
			{
				return CGLTF_ERROR_NOMEM;
			}
		}

		cgltf_size count = 0;
		for (int j = 0; j < size; ++j) {
			if (tokens[i].type != JSMN_STRING || tokens[i].size == 0) {
				continue;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "x") == 0) {
				++i; (*out_array)[0] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "y") == 0) {
				++i; (*out_array)[1] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "z") == 0) {
				++i; (*out_array)[2] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else {
				i = cgltf_skip_json(tokens, i + 1);
			}
			if (i < 0) return i;
		}
		if (count < 3) {
			return CGLTF_ERROR_JSON;
		}
		*out_size = count;
	}
	else {
		return CGLTF_ERROR_JSON;
	}
	return i;
}